

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::RandomBernoulliStaticLayerParams::InternalSwap
          (RandomBernoulliStaticLayerParams *this,RandomBernoulliStaticLayerParams *other)

{
  float fVar1;
  int iVar2;
  int64 iVar3;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->outputshape_,&other->outputshape_);
  iVar3 = this->seed_;
  this->seed_ = other->seed_;
  other->seed_ = iVar3;
  fVar1 = this->prob_;
  this->prob_ = other->prob_;
  other->prob_ = fVar1;
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void RandomBernoulliStaticLayerParams::InternalSwap(RandomBernoulliStaticLayerParams* other) {
  outputshape_.InternalSwap(&other->outputshape_);
  std::swap(seed_, other->seed_);
  std::swap(prob_, other->prob_);
  std::swap(_cached_size_, other->_cached_size_);
}